

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.h
# Opt level: O3

rtree_contents_t *
rtree_read(rtree_contents_t *__return_storage_ptr__,tsdn_t *tsdn,rtree_t *rtree,
          rtree_ctx_t *rtree_ctx,uintptr_t key)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 uVar5;
  edata_t *peVar6;
  rtree_leaf_elm_t *prVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  
  pvVar9 = (void *)((ulong)rtree_ctx & 0xffffffffc0000000);
  uVar10 = (ulong)(((uint)((ulong)rtree_ctx >> 0x1e) & 0xf) << 4);
  puVar1 = (undefined8 *)((long)&((rtree_t *)(rtree->root + -0xf))->base + uVar10);
  pvVar4 = *(void **)((long)&((rtree_t *)(rtree->root + -0xf))->base + uVar10);
  if (pvVar4 == pvVar9) {
    prVar7 = (rtree_leaf_elm_t *)((ulong)((uint)rtree_ctx >> 9 & 0x1ffff8) + puVar1[1]);
  }
  else if (rtree->root[0x11].child.repr == pvVar9) {
    pvVar8 = rtree->root[0x12].child.repr;
    rtree->root[0x11].child.repr = pvVar4;
    rtree->root[0x12].child.repr = (void *)puVar1[1];
LAB_0117a640:
    *puVar1 = pvVar9;
    puVar1[1] = pvVar8;
    prVar7 = (rtree_leaf_elm_t *)((ulong)((uint)rtree_ctx >> 9 & 0x1ffff8) + (long)pvVar8);
  }
  else {
    lVar11 = 0x118;
    do {
      if (*(void **)((long)(rtree->root + -0x10) + lVar11) == pvVar9) {
        pvVar8 = *(void **)((long)&((rtree_t *)(rtree->root + -0xf))->base + lVar11);
        puVar2 = (undefined8 *)((long)rtree + lVar11 + -0x18);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)(rtree->root + -0x10) + lVar11);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        *(void **)((long)rtree + lVar11 + -0x18) = pvVar4;
        *(undefined8 *)((long)rtree + lVar11 + -0x10) = puVar1[1];
        goto LAB_0117a640;
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x188);
    prVar7 = duckdb_je_rtree_leaf_elm_lookup_hard
                       (tsdn,&duckdb_je_arena_emap_global.rtree,(rtree_ctx_t *)rtree,
                        (uintptr_t)rtree_ctx,true,false);
  }
  pvVar4 = (prVar7->le_bits).repr;
  (__return_storage_ptr__->metadata).szind = (uint)(ushort)((ulong)pvVar4 >> 0x30);
  (__return_storage_ptr__->metadata).slab = (_Bool)((byte)pvVar4 & 1);
  (__return_storage_ptr__->metadata).is_head =
       (_Bool)((byte)(((ulong)pvVar4 & 0xffffffff) >> 1) & 1);
  (__return_storage_ptr__->metadata).state =
       (extent_state_t)((ulong)pvVar4 >> 2) & (extent_state_transition|extent_state_retained);
  peVar6 = (edata_t *)(((long)pvVar4 << 0x10) >> 0x10 & 0xffffffffffffff80);
  __return_storage_ptr__->edata = peVar6;
  return (rtree_contents_t *)peVar6;
}

Assistant:

static inline rtree_contents_t
rtree_read(tsdn_t *tsdn, rtree_t *rtree, rtree_ctx_t *rtree_ctx,
    uintptr_t key) {
	rtree_leaf_elm_t *elm = rtree_leaf_elm_lookup(tsdn, rtree, rtree_ctx,
	    key, /* dependent */ true, /* init_missing */ false);
	assert(elm != NULL);
	return rtree_leaf_elm_read(tsdn, rtree, elm, /* dependent */ true);
}